

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O3

int FindMinBits_TargetCollisionShare(int nbHashes,double share)

{
  long lVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  auVar4._0_8_ = (double)nbHashes;
  lVar1 = 2;
  do {
    dVar2 = ldexp(1.0,(int)lVar1);
    auVar3._0_8_ = (auVar4._0_8_ * (double)(nbHashes + -1)) / dVar2;
    auVar3._8_8_ = 0;
    auVar4._8_8_ = 0;
    auVar3 = vminsd_avx(auVar4,auVar3);
    if (auVar3._0_8_ < (double)((lVar1 << 0x34) + 0x3f847ae147ae147b)) goto LAB_0010abcd;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x40);
  lVar1 = 0x40;
LAB_0010abcd:
  return (int)lVar1;
}

Assistant:

static int FindMinBits_TargetCollisionShare(int nbHashes, double share)
{
    int nb;
    for (nb=2; nb<64; nb++) {
        double const maxColls = (double)(1ULL << nb) * share;
        double const nbColls = EstimateNbCollisions(nbHashes, nb);
        if (nbColls < maxColls) return nb;
    }
    assert(0);
    return nb;
}